

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O1

void __thiscall CMU462::PathTracer::set_frame_size(PathTracer *this,size_t width,size_t height)

{
  bool bVar1;
  
  if (READY < this->state) {
    stop(this);
  }
  HDRImageBuffer::resize(&this->sampleBuffer,width,height);
  ImageBuffer::resize(&this->frameBuffer,width,height);
  bVar1 = has_valid_configuration(this);
  if (bVar1) {
    this->state = READY;
  }
  return;
}

Assistant:

void PathTracer::set_frame_size(size_t width, size_t height) {
    if (state != INIT && state != READY) {
      stop();
    }
    sampleBuffer.resize(width, height);
    frameBuffer.resize(width, height);
    if (has_valid_configuration()) {
      state = READY;
    }
  }